

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  uint32_t r;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FILE *pFVar6;
  bool bVar7;
  
  pFVar6 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar6 = _stdout;
  }
  uVar3 = 0;
  fprintf(pFVar6,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  uVar4 = b->bits_left;
  iVar2 = 2;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar5 = 0;
    if (pbVar1 < b->end) {
      uVar5 = (uint)((*pbVar1 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar3 = uVar3 | uVar5 << ((byte)iVar2 & 0x1f);
    bVar7 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar7);
  h->aud->primary_pic_type = uVar3;
  pFVar6 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar6 = _stdout;
  }
  fprintf(pFVar6,"h->aud->primary_pic_type: %d \n",(ulong)uVar3);
  return;
}

Assistant:

void read_debug_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); h->aud->primary_pic_type = bs_read_u(b, 3); printf("h->aud->primary_pic_type: %d \n", h->aud->primary_pic_type); 
}